

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvp.h
# Opt level: O3

void __thiscall
hiberlite::
sql_nvp<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
::sql_nvp(sql_nvp<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
          *this,string *_name,
         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         *_value,string *search)

{
  pointer pcVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + _name->_M_string_length);
  this->value = _value;
  (this->search_key)._M_dataplus._M_p = (pointer)&(this->search_key).field_2;
  pcVar1 = (search->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->search_key,pcVar1,pcVar1 + search->_M_string_length);
  return;
}

Assistant:

sql_nvp(std::string _name, C& _value, std::string search="") : name(_name), value(_value), search_key(search) {}